

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O3

void MListInsert(Col_Word *nodePtr,size_t index,Col_Word list)

{
  byte bVar1;
  byte *list_00;
  byte bVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  Col_Word CVar6;
  Col_Word CVar7;
  ulong *mvector;
  Col_Word *left;
  uint uVar8;
  ulong extraout_RDX;
  undefined8 unaff_RBP;
  ulong length;
  Col_Word *pCVar9;
  byte *pbVar10;
  size_t max;
  MergeListChunksInfo info;
  undefined8 uStack_c8;
  Col_Word CStack_c0;
  Col_Word *pCStack_b8;
  size_t sStack_b0;
  size_t sStack_a8;
  Col_Word *pCStack_a0;
  size_t sStack_98;
  code *pcStack_90;
  size_t local_40;
  Col_Word local_38;
  
  pcStack_90 = (code *)0x111471;
  sVar3 = Col_ListLength(*nodePtr);
  pcStack_90 = (code *)0x11147c;
  sVar4 = Col_ListLength(list);
  if (sVar3 == 0) {
    pcStack_90 = (code *)0x1116c0;
    CVar7 = Col_CopyMList(list);
    *nodePtr = CVar7;
    return;
  }
  uVar5 = sVar4 + sVar3;
  max = sVar3 - index;
LAB_001114ca:
  mvector = (ulong *)*nodePtr;
  do {
    if (mvector == (ulong *)0x0) {
      uVar8 = 0;
    }
    else {
      if (((ulong)mvector & 0xf) == 0) {
        uVar8 = 0xffffffff;
        if (((byte)*mvector & 2) == 0) goto LAB_0011153a;
        uVar8 = (byte)*mvector & 0xfffffffe;
      }
      else {
        uVar8 = immediateWordTypes[(uint)mvector & 0x1f];
      }
      if (uVar8 == 0x1a) {
        uVar8 = 0x1a;
        if (sVar4 <= ((*mvector >> 3 & 0xffffffffffffffe0) - 0x10 >> 3) - sVar3) {
          pcStack_90 = (code *)0x1117da;
          Col_MVectorSetLength((Col_Word)mvector,uVar5);
          pcStack_90 = (code *)0x1117fd;
          memmove(mvector + index + sVar4 + 2,mvector + index + 2,max * 8);
          local_38 = *nodePtr;
          pcStack_90 = (code *)0x11182c;
          local_40 = index;
          Col_TraverseListChunks(list,0,sVar4,0,MergeListChunksProc,&local_40,(size_t *)0x0);
          return;
        }
      }
      else if (uVar8 == 0x26) {
        sVar3 = (size_t)*(ushort *)((long)mvector + 2);
        CVar7 = mvector[2];
        if (sVar3 == 0) {
          pcStack_90 = (code *)0x11178f;
          sVar3 = Col_ListLength(CVar7);
        }
        if (index == sVar3) {
          CVar6 = *nodePtr;
          bVar1 = *(byte *)(CVar6 + 1);
          if (bVar1 < 2) goto LAB_0011183b;
          pcStack_90 = (code *)0x1117b4;
          bVar2 = GetDepth(CVar7);
          if (bVar1 - 1 <= (uint)bVar2) goto LAB_0011183b;
LAB_00111850:
          pCVar9 = (Col_Word *)(CVar6 + 0x10);
          sVar4 = index;
        }
        else {
LAB_0011183b:
          CVar6 = *nodePtr;
          sVar4 = index - sVar3;
          if (index < sVar3 || sVar4 == 0) goto LAB_00111850;
          pCVar9 = (Col_Word *)(CVar6 + 0x18);
        }
        pcStack_90 = (code *)0x11185d;
        MListInsert(pCVar9,sVar4,list);
        CVar7 = *nodePtr;
        goto LAB_00111860;
      }
    }
LAB_0011153a:
    if (uVar5 < 0x27) {
      pcStack_90 = (code *)0x1116d8;
      CVar7 = Col_NewMVector(0,uVar5,(Col_Word *)0x0);
      local_40 = 0;
      pcStack_90 = (code *)0x111709;
      local_38 = CVar7;
      Col_TraverseListChunks(*nodePtr,0,index,0,MergeListChunksProc,&local_40,(size_t *)0x0);
      pcStack_90 = (code *)0x111726;
      Col_TraverseListChunks(list,0,sVar4,0,MergeListChunksProc,&local_40,(size_t *)0x0);
      pcStack_90 = (code *)0x111742;
      Col_TraverseListChunks(*nodePtr,index,max,0,MergeListChunksProc,&local_40,(size_t *)0x0);
      *nodePtr = CVar7;
      return;
    }
    if (uVar8 == 0x1e) {
      if (*(byte *)((long)mvector + 1) != 0) break;
    }
    else if (uVar8 == 0x22) break;
    if ((index > sVar3 || max == 0) || index == 0) {
      pcStack_90 = (code *)0x111754;
      CVar6 = Col_CopyMList(list);
      CVar7 = *nodePtr;
      if (index != 0) {
        CVar7 = CVar6;
        CVar6 = *nodePtr;
      }
      pcStack_90 = (code *)0x11176c;
      CVar7 = NewMConcatList(CVar6,CVar7);
      *nodePtr = CVar7;
LAB_00111860:
      UpdateMConcatNode(CVar7);
      return;
    }
    pcStack_90 = (code *)0x111572;
    sStack_b0 = Col_ListLength((Col_Word)mvector);
    pbVar10 = (byte *)*nodePtr;
    if (((ulong)pbVar10 & 0xf) == 0) {
      if ((*pbVar10 & 2) != 0) {
        uVar8 = *pbVar10 & 0xfffffffe;
        goto LAB_0011159f;
      }
LAB_001115fd:
      pcStack_90 = (code *)0x11160c;
      CVar7 = Col_Sublist((Col_Word)pbVar10,0,index - 1);
      pcStack_90 = (code *)0x111620;
      CVar6 = Col_Sublist(*nodePtr,index,sStack_b0 - 1);
    }
    else {
      uVar8 = immediateWordTypes[(uint)pbVar10 & 0x1f];
LAB_0011159f:
      if ((int)uVar8 < 0x16) {
        if (uVar8 != 0xfffffff9) goto LAB_001115fd;
        CVar6 = (sStack_b0 - index) * 0x20 | 0x14;
        CVar7 = index << 5 | 0x14;
      }
      else {
        if ((uVar8 != 0x16) && (uVar8 != 0x1a)) {
          list_00 = *(byte **)(pbVar10 + 8);
          sStack_98 = *(size_t *)(pbVar10 + 0x10);
          if (((ulong)list_00 & 0xf) == 0) {
            if ((*list_00 & 2) != 0) {
              uVar8 = *list_00 & 0xfffffffe;
              goto LAB_0011165b;
            }
          }
          else {
            uVar8 = immediateWordTypes[(uint)list_00 & 0x1f];
LAB_0011165b:
            if (uVar8 == 0x16) {
              pbVar10 = list_00 + sStack_98 * 8;
              pcStack_90 = (code *)0x111685;
              CVar6 = Col_NewMVector(0,sStack_b0 - index,
                                     (Col_Word *)(list_00 + index * 8 + sStack_98 * 8 + 0x10));
              goto LAB_00111688;
            }
          }
          pcStack_90 = (code *)0x111886;
          left = (Col_Word *)Col_Sublist((Col_Word)list_00,sStack_98,(sStack_98 + index) - 1);
          pcStack_90 = (code *)0x11189b;
          CVar7 = Col_Sublist(*nodePtr,sStack_98 + index,(sStack_b0 + sStack_98) - 1);
          pcStack_90 = MListRemove;
          pCVar9 = left;
          NewMConcatList((Col_Word)left,CVar7);
          pCStack_b8 = nodePtr;
          sStack_a8 = sStack_98 + index;
          pCStack_a0 = left;
          pcStack_90 = (code *)CONCAT71((int7)((ulong)unaff_RBP >> 8),
                                        (index <= sVar3 && max != 0) && index != 0);
          sVar3 = Col_ListLength(*pCVar9);
          uVar5 = sVar3 - 1;
          if (uVar5 == extraout_RDX && CVar7 == 0) {
            *pCVar9 = 0x14;
            return;
          }
          length = ~extraout_RDX + CVar7 + sVar3;
          goto LAB_001118f2;
        }
        pcStack_90 = (code *)0x1115c6;
        CVar6 = Col_NewMVector(0,sStack_b0 - index,(Col_Word *)(pbVar10 + index * 8 + 0x10));
        if (uVar8 == 0x1a) {
          pcStack_90 = (code *)0x1115da;
          Col_MVectorSetLength(*nodePtr,index);
          CVar7 = *nodePtr;
          goto LAB_0011169b;
        }
LAB_00111688:
        pcStack_90 = (code *)0x111695;
        CVar7 = Col_NewMVector(0,index,(Col_Word *)(pbVar10 + 0x10));
      }
    }
LAB_0011169b:
    pcStack_90 = (code *)0x1116a0;
    mvector = (ulong *)NewMConcatList(CVar7,CVar6);
    *nodePtr = (Col_Word)mvector;
  } while( true );
  pcStack_90 = (code *)0x1116b3;
  ConvertToMConcatNode(nodePtr);
  goto LAB_001114ca;
LAB_001118f2:
  pbVar10 = (byte *)*pCVar9;
  if (pbVar10 == (byte *)0x0) {
    uVar8 = 0;
  }
  else {
    if (((ulong)pbVar10 & 0xf) == 0) {
      uVar8 = 0xffffffff;
      if ((*pbVar10 & 2) == 0) goto LAB_00111942;
      uVar8 = *pbVar10 & 0xfffffffe;
    }
    else {
      uVar8 = immediateWordTypes[(uint)pbVar10 & 0x1f];
    }
    if (uVar8 == 0xfffffff9) {
      *pCVar9 = length * 0x20 | 0x14;
      return;
    }
    if (uVar8 == 0x1a) {
      if (extraout_RDX < uVar5) {
        memmove(pbVar10 + CVar7 * 8 + 0x10,pbVar10 + extraout_RDX * 8 + 0x18,
                (sVar3 + ~extraout_RDX) * 8);
        pbVar10 = (byte *)*pCVar9;
      }
      Col_MVectorSetLength((Col_Word)pbVar10,length);
      return;
    }
    if (uVar8 == 0x26) {
      sVar3 = (size_t)*(ushort *)(pbVar10 + 2);
      if (sVar3 == 0) {
        sVar3 = Col_ListLength(*(Col_Word *)(pbVar10 + 0x10));
      }
      if (sVar3 <= extraout_RDX) {
        sVar4 = 0;
        if (sVar3 <= CVar7) {
          sVar4 = CVar7 - sVar3;
        }
        MListRemove((Col_Word *)(*pCVar9 + 0x18),sVar4,extraout_RDX - sVar3);
      }
      if (CVar7 < sVar3) {
        sVar4 = sVar3 - 1;
        if (extraout_RDX < sVar3) {
          sVar4 = extraout_RDX;
        }
        MListRemove((Col_Word *)(*pCVar9 + 0x10),CVar7,sVar4);
        sVar3 = Col_ListLength(*(Col_Word *)(*pCVar9 + 0x10));
      }
      if (sVar3 != 0) {
        sVar3 = Col_ListLength(*(Col_Word *)(*pCVar9 + 0x18));
        if (sVar3 == 0) {
          *pCVar9 = *(Col_Word *)(*pCVar9 + 0x10);
          return;
        }
        UpdateMConcatNode(*pCVar9);
        return;
      }
      *pCVar9 = *(Col_Word *)(*pCVar9 + 0x18);
      return;
    }
  }
LAB_00111942:
  if (length < 0x27) {
    CVar6 = Col_NewMVector(0,length,(Col_Word *)0x0);
    uStack_c8 = 0;
    CStack_c0 = CVar6;
    Col_TraverseListChunks(*pCVar9,0,CVar7,0,MergeListChunksProc,&uStack_c8,(size_t *)0x0);
    Col_TraverseListChunks
              (*pCVar9,extraout_RDX + 1,sVar3 - extraout_RDX,0,MergeListChunksProc,&uStack_c8,
               (size_t *)0x0);
    *pCVar9 = CVar6;
    return;
  }
  if (uVar8 == 0x1e) {
    if (pbVar10[1] == 0) {
LAB_001119cd:
      if (CVar7 == 0) {
        CVar7 = Col_Sublist((Col_Word)pbVar10,extraout_RDX + 1,uVar5);
      }
      else {
        CVar7 = Col_Sublist((Col_Word)pbVar10,0,CVar7 - 1);
        if (extraout_RDX < uVar5) {
          CVar6 = Col_Sublist(*pCVar9,extraout_RDX + 1,uVar5);
          CVar7 = NewMConcatList(CVar7,CVar6);
        }
      }
      *pCVar9 = CVar7;
      return;
    }
  }
  else if (uVar8 != 0x22) goto LAB_001119cd;
  ConvertToMConcatNode(pCVar9);
  goto LAB_001118f2;
}

Assistant:

static void
MListInsert(
    Col_Word * nodePtr, /*!< [in,out] Mutable list node to insert into. May be
                             overwritten in the process (e.g. if it gets
                             converted to mutable). */
    size_t index,       /*!< Index of insertion point. */
    Col_Word list)      /*!< List to insert. */
{
    size_t length = Col_ListLength(*nodePtr);
    size_t listLength = Col_ListLength(list);
    int type;

    ASSERT(index <= length);
    ASSERT(SIZE_MAX-length >= listLength);
    ASSERT(listLength > 0);

    if (length == 0) {
        /*
         * Replace content.
         */

        *nodePtr = Col_CopyMList(list);
        return;
    }

    /*
     * Entry point for tail recursive calls.
     */

start:

    /*
     * First try to alter mutable types if possible.
     */

    type = WORD_TYPE(*nodePtr);
    switch (type) {
    case WORD_TYPE_MCONCATLIST: {
        size_t leftLength = WORD_CONCATLIST_LEFT_LENGTH(*nodePtr);
        Col_Word left = WORD_CONCATLIST_LEFT(*nodePtr);
        if (leftLength == 0) {
            leftLength = Col_ListLength(left);
        }

        if (index == leftLength && WORD_CONCATLIST_DEPTH(*nodePtr) > 1) {
            /*
             * Insertion point is just between the two arms. Insert into
             * the shallowest one to balance tree.
             */

            if (GetDepth(left) < WORD_CONCATLIST_DEPTH(*nodePtr)-1) {
                /*
                 * Right is deeper, insert into left.
                 */

                MListInsert(&WORD_CONCATLIST_LEFT(*nodePtr), index,
                        list);
                UpdateMConcatNode(*nodePtr);
                return;
            }
        }

        if (index <= leftLength) {
            /*
             * Insert into left.
             */

            MListInsert(&WORD_CONCATLIST_LEFT(*nodePtr), index, list);
        } else {
            /*
             * Insert into right.
             */

            MListInsert(&WORD_CONCATLIST_RIGHT(*nodePtr),
                    index-leftLength, list);
        }
        UpdateMConcatNode(*nodePtr);
        return;
        }

    case WORD_TYPE_MVECTOR: {
        size_t maxLength = VECTOR_MAX_LENGTH(WORD_MVECTOR_SIZE(*nodePtr)
                * CELL_SIZE);
        Col_Word *elements = WORD_VECTOR_ELEMENTS(*nodePtr);
        if (listLength <= maxLength-length) {
            /*
             * Insert data directly into available space.
             */

            MergeListChunksInfo info;

            Col_MVectorSetLength(*nodePtr, length+listLength);

            /*
             * Move trailing elements.
             */

            memmove(elements+index+listLength, elements+index,
                    (length-index) * sizeof(*elements));

            /*
             * Copy elements from list.
             */

            info.length = index;
            info.vector = *nodePtr;
            Col_TraverseListChunks(list, 0, listLength, 0, MergeListChunksProc,
                    &info, NULL);
            ASSERT(info.length == index+listLength);
            return;
        }

        /*
         * Try other methods below.
         */

        break;
        }

    }

    if (length+listLength <= MAX_SHORT_MVECTOR_LENGTH) {
        /*
         * Merge all chunks into one mutable vector for short lists.
         * TODO: geometric growth?
         */

        MergeListChunksInfo info;

        Col_Word node = Col_NewMVector(0, length+listLength, NULL);

        info.length = 0;
        info.vector = node;
        Col_TraverseListChunks(*nodePtr, 0, index, 0, MergeListChunksProc,
                &info, NULL);
        Col_TraverseListChunks(list, 0, listLength, 0, MergeListChunksProc,
                &info, NULL);
        Col_TraverseListChunks(*nodePtr, index, length-index, 0,
                MergeListChunksProc, &info, NULL);
        ASSERT(info.length == length+listLength);

        *nodePtr = node;
        return;
    }

    /*
     * General case with immutable types and mutable with no available space.
     */

    switch (type) {
    case WORD_TYPE_CONCATLIST:
        /*
         * Convert to mutable concat then retry.
         */

        ConvertToMConcatNode(nodePtr);
        goto start;

    case WORD_TYPE_SUBLIST:
        if (WORD_SUBLIST_DEPTH(*nodePtr) >= 1) {
            /*
             * Source is concat. Convert to mutable concat then retry.
             */

            ConvertToMConcatNode(nodePtr);
            goto start;
        }
        /* continued. */
    default:
        if (index > 0 && index < length) {
            /*
             * Split at insertion point then retry.
             */

            SplitMutableAt(nodePtr, index);
            goto start;
        }

        /*
         * Build a mutable concat node with current node and list to insert.
         */

        list = Col_CopyMList(list);
        if (index == 0) {
            /*
             * Insert before.
             */

            *nodePtr = NewMConcatList(list, *nodePtr);
        } else {
            /*
             * Insert after.
             */

            ASSERT(index >= length);
            *nodePtr = NewMConcatList(*nodePtr, list);
        }
        UpdateMConcatNode(*nodePtr);
        return;
    }
}